

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall
FxIdentifier::ResolveMember
          (FxIdentifier *this,FCompileContext *ctx,PStruct *classctx,FxExpression **object,
          PStruct *objtype)

{
  _func_int **pp_Var1;
  PSymbol *pPVar2;
  PSymbolTable *mem;
  bool bVar3;
  int iVar4;
  FxClassDefaults *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  PClass *pPVar6;
  char *pcVar7;
  FxStructMember *local_e0;
  FxStructMember *x_1;
  PField *vsym;
  FxClassDefaults *local_58;
  FxExpression *x;
  PSymbolTable *pPStack_48;
  bool isclass;
  PSymbolTable *symtbl;
  PSymbol *sym;
  PStruct *objtype_local;
  FxExpression **object_local;
  PStruct *classctx_local;
  FCompileContext *ctx_local;
  FxIdentifier *this_local;
  
  sym = (PSymbol *)objtype;
  objtype_local = (PStruct *)object;
  object_local = (FxExpression **)classctx;
  classctx_local = (PStruct *)ctx;
  ctx_local = (FCompileContext *)this;
  x._7_1_ = DObject::IsKindOf((DObject *)objtype,PClass::RegistrationInfo.MyClass);
  bVar3 = FName::operator==(&this->Identifier,NAME_Default);
  if (bVar3) {
    pPVar6 = PClassActor::RegistrationInfo.MyClass;
    bVar3 = DObject::IsKindOf((DObject *)sym,PClassActor::RegistrationInfo.MyClass);
    if (bVar3) {
      this_00 = (FxClassDefaults *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar6);
      FxClassDefaults::FxClassDefaults
                (this_00,(FxExpression *)
                         (objtype_local->super_PNamedType).super_PCompoundType.super_PType.
                         super_PTypeBase.super_DObject._vptr_DObject,
                 &(this->super_FxExpression).ScriptPosition);
      (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
      super_DObject._vptr_DObject = (_func_int **)0x0;
      local_58 = this_00;
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar4 = (*(local_58->super_FxExpression)._vptr_FxExpression[2])(local_58,classctx_local);
      this_local = (FxIdentifier *)CONCAT44(extraout_var,iVar4);
    }
    else {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'Default\' requires an actor type.")
      ;
      if (this != (FxIdentifier *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxIdentifier *)0x0;
    }
  }
  else {
    pPVar2 = sym + 1;
    FName::FName((FName *)&vsym,&this->Identifier);
    symtbl = (PSymbolTable *)
             PSymbolTable::FindSymbolInTable
                       ((PSymbolTable *)&(pPVar2->super_PTypeBase).super_DObject.ObjNext,
                        (FName *)&vsym,&stack0xffffffffffffffb8);
    if ((DObject *)symtbl == (DObject *)0x0) {
      pcVar5 = FName::GetChars(&this->Identifier);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Unknown identifier \'%s\'",pcVar5);
      pp_Var1 = (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                super_DObject._vptr_DObject;
      if (pp_Var1 != (_func_int **)0x0) {
        (**(code **)(*pp_Var1 + 8))();
      }
      (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
      super_DObject._vptr_DObject = (_func_int **)0x0;
      this_local = (FxIdentifier *)0x0;
    }
    else {
      bVar3 = DObject::IsKindOf((DObject *)symtbl,PSymbolConst::RegistrationInfo.MyClass);
      if (bVar3) {
        pcVar5 = FName::GetChars(&this->Identifier);
        pcVar7 = "struct";
        if ((x._7_1_ & 1) != 0) {
          pcVar7 = "class";
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,8,
                   "Resolving name \'%s\' as %s constant\n",pcVar5,pcVar7);
        pp_Var1 = (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                  super_DObject._vptr_DObject;
        if (pp_Var1 != (_func_int **)0x0) {
          (**(code **)(*pp_Var1 + 8))();
        }
        (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
        super_DObject._vptr_DObject = (_func_int **)0x0;
        this_local = (FxIdentifier *)
                     FxConstant::MakeConstant
                               ((PSymbol *)symtbl,&(this->super_FxExpression).ScriptPosition);
      }
      else {
        pPVar6 = PField::RegistrationInfo.MyClass;
        bVar3 = DObject::IsKindOf((DObject *)symtbl,PField::RegistrationInfo.MyClass);
        mem = symtbl;
        if (bVar3) {
          if (((symtbl[1].Symbols.Size & 0x80) != 0) &&
             (((ulong)(classctx_local->super_PNamedType).super_PCompoundType.super_PType.HashNext &
              1) == 0)) {
            pcVar5 = FName::GetChars((FName *)((long)&symtbl[1].ParentSymbolTable + 4));
            pPVar6 = (PClass *)0x0;
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,0,
                       "Accessing deprecated member variable %s",pcVar5);
          }
          if (((mem[1].Symbols.Size & 0x20) == 0) ||
             (pPStack_48 == (PSymbolTable *)(object_local + 7))) {
            if ((x._7_1_ & 1) == 0) {
              local_e0 = (FxStructMember *)
                         FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar6);
              FxStructMember::FxStructMember
                        (local_e0,(FxExpression *)
                                  (objtype_local->super_PNamedType).super_PCompoundType.super_PType.
                                  super_PTypeBase.super_DObject._vptr_DObject,(PField *)mem,
                         &(this->super_FxExpression).ScriptPosition);
            }
            else {
              local_e0 = (FxStructMember *)
                         FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar6);
              FxClassMember::FxClassMember
                        ((FxClassMember *)local_e0,
                         (FxExpression *)
                         (objtype_local->super_PNamedType).super_PCompoundType.super_PType.
                         super_PTypeBase.super_DObject._vptr_DObject,(PField *)mem,
                         &(this->super_FxExpression).ScriptPosition);
            }
            (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
            super_DObject._vptr_DObject = (_func_int **)0x0;
            iVar4 = (*(((FxStructMember *)&local_e0->super_FxExpression)->super_FxExpression).
                      _vptr_FxExpression[2])(local_e0,classctx_local);
            this_local = (FxIdentifier *)CONCAT44(extraout_var_00,iVar4);
          }
          else {
            pcVar5 = FName::GetChars((FName *)((long)&mem[1].ParentSymbolTable + 4));
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Private member %s not accessible",pcVar5);
            this_local = (FxIdentifier *)0x0;
          }
        }
        else {
          bVar3 = DObject::IsKindOf((DObject *)symtbl,PFunction::RegistrationInfo.MyClass);
          if (bVar3) {
            pcVar5 = FName::GetChars(&this->Identifier);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Function \'%s\' used without ().\n",pcVar5);
          }
          else {
            pcVar5 = FName::GetChars(&this->Identifier);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Invalid member identifier \'%s\'.\n",pcVar5);
          }
          pp_Var1 = (objtype_local->super_PNamedType).super_PCompoundType.super_PType.
                    super_PTypeBase.super_DObject._vptr_DObject;
          if (pp_Var1 != (_func_int **)0x0) {
            (**(code **)(*pp_Var1 + 8))();
          }
          (objtype_local->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
          super_DObject._vptr_DObject = (_func_int **)0x0;
          this_local = (FxIdentifier *)0x0;
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxIdentifier::ResolveMember(FCompileContext &ctx, PStruct *classctx, FxExpression *&object, PStruct *objtype)
{
	PSymbol *sym;
	PSymbolTable *symtbl;
	bool isclass = objtype->IsKindOf(RUNTIME_CLASS(PClass));

	if (Identifier == NAME_Default)
	{
		if (!objtype->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(object, ScriptPosition);
		object = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if ((sym = objtype->Symbols.FindSymbolInTable(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as %s constant\n", Identifier.GetChars(), isclass ? "class" : "struct");
			delete object;
			object = nullptr;
			return FxConstant::MakeConstant(sym, ScriptPosition);
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			PField *vsym = static_cast<PField*>(sym);

			// We have 4 cases to consider here:
			// 1. The symbol is a static/meta member (not implemented yet) which is always accessible.
			// 2. This is a static function 
			// 3. This is an action function with a restricted self pointer
			// 4. This is a normal member or unrestricted action function.
			if (vsym->Flags & VARF_Deprecated && !ctx.FromDecorate)
			{
				ScriptPosition.Message(MSG_WARNING, "Accessing deprecated member variable %s", vsym->SymbolName.GetChars());
			}
			if ((vsym->Flags & VARF_Private) && symtbl != &classctx->Symbols)
			{
				ScriptPosition.Message(MSG_ERROR, "Private member %s not accessible", vsym->SymbolName.GetChars());
				return nullptr;
			}

			auto x = isclass ? new FxClassMember(object, vsym, ScriptPosition) : new FxStructMember(object, vsym, ScriptPosition);
			object = nullptr;
			return x->Resolve(ctx);
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete object;
			object = nullptr;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
		delete object;
		object = nullptr;
		return nullptr;
	}
}